

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O3

int FIX::socket_setsockopt(socket_handle s,int opt,int optval)

{
  int iVar1;
  undefined1 local_4 [4];
  
  iVar1 = setsockopt(s,(uint)(opt == 1) * 5 + 1,opt,local_4,4);
  return iVar1;
}

Assistant:

int socket_setsockopt(socket_handle s, int opt, int optval) {
  int level = SOL_SOCKET;
  if (opt == TCP_NODELAY) {
    level = IPPROTO_TCP;
  }

#ifdef _MSC_VER
  return ::setsockopt(s, level, opt, (char *)&optval, sizeof(optval));
#else
  return ::setsockopt(s, level, opt, &optval, sizeof(optval));
#endif
}